

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

mpc_val_t * mpca_stmt_list_apply_to(mpc_val_t *x,void *s)

{
  undefined8 uVar1;
  mpc_parser_t *p;
  void *pvVar2;
  mpc_parser_t *a;
  undefined8 *puVar3;
  undefined8 *__ptr;
  
  __ptr = *x;
  if (__ptr != (undefined8 *)0x0) {
    puVar3 = (undefined8 *)((long)x + 8);
    do {
      p = mpca_grammar_find_parser((char *)*__ptr,(mpca_grammar_st_t *)s);
      if ((*(byte *)((long)s + 0x18) & 1) != 0) {
        uVar1 = __ptr[2];
        pvVar2 = calloc(1,0x38);
        *(undefined1 *)((long)pvVar2 + 0x30) = 0x11;
        *(undefined8 *)((long)pvVar2 + 8) = uVar1;
        __ptr[2] = pvVar2;
      }
      a = (mpc_parser_t *)__ptr[2];
      if ((char *)__ptr[1] != (char *)0x0) {
        a = mpc_expect(a,(char *)__ptr[1]);
        __ptr[2] = a;
      }
      mpc_optimise_unretained(a,1);
      mpc_define(p,(mpc_parser_t *)__ptr[2]);
      free((void *)*__ptr);
      free((void *)__ptr[1]);
      free(__ptr);
      __ptr = (undefined8 *)*puVar3;
      puVar3 = puVar3 + 1;
    } while (__ptr != (undefined8 *)0x0);
  }
  free(x);
  return (mpc_val_t *)0x0;
}

Assistant:

static mpc_val_t *mpca_stmt_list_apply_to(mpc_val_t *x, void *s) {

  mpca_grammar_st_t *st = s;
  mpca_stmt_t *stmt;
  mpca_stmt_t **stmts = x;
  mpc_parser_t *left;

  while(*stmts) {
    stmt = *stmts;
    left = mpca_grammar_find_parser(stmt->ident, st);
    if (st->flags & MPCA_LANG_PREDICTIVE) { stmt->grammar = mpc_predictive(stmt->grammar); }
    if (stmt->name) { stmt->grammar = mpc_expect(stmt->grammar, stmt->name); }
    mpc_optimise(stmt->grammar);
    mpc_define(left, stmt->grammar);
    free(stmt->ident);
    free(stmt->name);
    free(stmt);
    stmts++;
  }

  free(x);

  return NULL;
}